

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Normalize
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  uchar *puVar5;
  uchar *puVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 in_XMM3_Qb;
  allocator_type local_69;
  uint32_t local_68;
  uint32_t local_64;
  double local_60;
  ulong local_58;
  ulong local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> value;
  
  local_68 = startXOut;
  local_64 = startYOut;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  bVar2 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
  uVar1 = in->_rowSize;
  bVar3 = 0xff;
  bVar7 = 0;
  puVar5 = in->_data + (ulong)(bVar2 * startXIn) + (ulong)(uVar1 * startYIn);
  puVar6 = puVar5 + uVar1 * height;
  for (; puVar5 != puVar6; puVar5 = puVar5 + uVar1) {
    for (uVar8 = 0; bVar2 * width != uVar8; uVar8 = uVar8 + 1) {
      bVar9 = puVar5[uVar8];
      if (bVar9 <= bVar3) {
        bVar3 = bVar9;
      }
      if (bVar9 < bVar7) {
        bVar9 = bVar7;
      }
      bVar7 = bVar9;
    }
  }
  local_58 = (ulong)height;
  local_50 = (ulong)width;
  if (bVar3 == bVar7 || bVar7 == 0xff && bVar3 == 0) {
    Copy(in,startXIn,startYIn,out,local_68,local_64,width,height);
    return;
  }
  local_60 = 255.0 / (double)(int)((uint)bVar7 - (uint)bVar3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&value,0x100,&local_69);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_60;
  for (lVar4 = 0; lVar4 != 0x100; lVar4 = lVar4 + 1) {
    auVar10._0_8_ = (double)(int)((int)lVar4 - (uint)bVar3);
    auVar10._8_8_ = in_XMM3_Qb;
    auVar10 = vfmadd213sd_fma(auVar10,auVar11,ZEXT816(0x3fe0000000000000));
    value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4] = (uchar)(int)auVar10._0_8_;
  }
  LookupTable(in,startXIn,startYIn,out,local_68,local_64,(uint32_t)local_50,(uint32_t)local_58,
              &value);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void Normalize( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        const uint8_t colorCount = CommonColorCount( in, out );
        const uint32_t rowSizeIn = in.rowSize();

        const uint8_t * inY    = in.data()  + startYIn  * rowSizeIn + startXIn * colorCount;
        const uint8_t * inYEnd = inY + height * rowSizeIn;

        uint8_t minimum = 255;
        uint8_t maximum = 0;

        const uint32_t realWidth = width * colorCount;

        for( ; inY != inYEnd; inY += rowSizeIn ) {
            const uint8_t * inX = inY;
            const uint8_t * inXEnd = inX + realWidth;

            for( ; inX != inXEnd; ++inX ) {
                if( minimum > (*inX) )
                    minimum = (*inX);

                if( maximum < (*inX) )
                    maximum = (*inX);
            }
        }

        if( (minimum == 0 && maximum == 255) || (minimum == maximum) ) {
            Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const double correction = 255.0 / (maximum - minimum);

            // We precalculate all values and store them in lookup table
            std::vector < uint8_t > value( 256 );

            for( uint16_t i = 0; i < 256; ++i )
                value[i] = static_cast <uint8_t>((i - minimum) * correction + 0.5);

            LookupTable( in, startXIn, startYIn, out, startXOut, startYOut, width, height, value );
        }
    }